

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform_folders.cpp
# Opt level: O0

void __thiscall sago::PlatformFolders::PlatformFolders(PlatformFolders *this)

{
  PlatformFoldersData *this_00;
  PlatformFolders *this_local;
  
  this_00 = (PlatformFoldersData *)operator_new(0x30);
  (this_00->folders)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this_00->folders)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this_00->folders)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this_00->folders)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  *(undefined8 *)&(this_00->folders)._M_t._M_impl = 0;
  *(undefined8 *)&(this_00->folders)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  PlatformFoldersData::PlatformFoldersData(this_00);
  this->data = this_00;
  PlatformFoldersFillData(&this->data->folders);
  return;
}

Assistant:

PlatformFolders::PlatformFolders() {
#if !defined(_WIN32) && !defined(__APPLE__)
	this->data = new PlatformFolders::PlatformFoldersData();
	try {
		PlatformFoldersFillData(data->folders);
	}
	catch (...) {
		delete this->data;
		throw;
	}
#endif
}